

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O0

Roaring64Map * __thiscall doublechecked::Roaring64Map::operator^(Roaring64Map *this,Roaring64Map *o)

{
  undefined1 uVar1;
  Roaring64Map *pRVar2;
  Roaring64Map *in_RSI;
  Roaring64Map *in_RDI;
  Roaring64Map inplace;
  Roaring64Map *ans;
  int in_stack_fffffffffffffefc;
  undefined7 in_stack_ffffffffffffff00;
  Roaring64Map *in_stack_ffffffffffffff60;
  Roaring64Map *in_stack_ffffffffffffff68;
  Roaring64Map *in_stack_ffffffffffffffa8;
  Roaring64Map *in_stack_ffffffffffffffb0;
  Roaring64Map *in_stack_ffffffffffffffc8;
  Roaring64Map *in_stack_ffffffffffffffd0;
  
  pRVar2 = in_RDI;
  roaring::Roaring64Map::operator^(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  Roaring64Map(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x113329);
  Roaring64Map(pRVar2,in_RSI);
  pRVar2 = operator^=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  uVar1 = operator==(in_RDI,pRVar2);
  _assert_true((unsigned_long)in_RDI,(char *)pRVar2,
               (char *)CONCAT17(uVar1,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc);
  ~Roaring64Map((Roaring64Map *)CONCAT17(uVar1,in_stack_ffffffffffffff00));
  return in_RDI;
}

Assistant:

Roaring64Map operator^(const Roaring64Map &o) const {
        Roaring64Map ans(plain ^ o.plain);

        Roaring64Map inplace(*this);
        assert_true(ans ==
                    (inplace ^= o));  // validate against in-place version

        return ans;
    }